

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueless_test.cpp
# Opt level: O0

void testValueless_CallbackCalled_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string *this;
  bool triggered;
  Argengine ae;
  anon_class_8_1_eeed5af7 *in_stack_fffffffffffffdc8;
  function<void_()> *in_stack_fffffffffffffdd0;
  allocator_type *in_stack_fffffffffffffde8;
  allocator<char> *in_stack_fffffffffffffdf0;
  iterator in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe08;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe10;
  string *psVar1;
  iterator in_stack_fffffffffffffe18;
  size_type in_stack_fffffffffffffe20;
  string *local_1a0;
  allocator<char> local_169;
  string local_168 [32];
  byte *local_148;
  undefined1 local_140 [37];
  undefined1 local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  string *local_118;
  string local_110 [32];
  undefined1 local_f0 [32];
  string *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  byte local_90 [2];
  undefined1 local_8e;
  allocator<char> local_8d [20];
  allocator<char> local_79;
  string *local_78;
  string local_70 [32];
  undefined1 local_50 [32];
  string *local_30;
  undefined8 local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_8e = 1;
  local_78 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_78 = (string *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_8e = 0;
  local_30 = local_70;
  local_28 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x106c5e);
  __l._M_len = (size_type)in_stack_fffffffffffffe00;
  __l._M_array = in_stack_fffffffffffffdf8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffdf0,__l,in_stack_fffffffffffffde8);
  juzzlin::Argengine::Argengine(local_8,local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffdd0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x106cbb);
  local_1a0 = (string *)&local_30;
  do {
    local_1a0 = local_1a0 + -0x20;
    std::__cxx11::string::~string(local_1a0);
  } while (local_1a0 != local_70);
  std::allocator<char>::~allocator(local_8d);
  std::allocator<char>::~allocator(&local_79);
  local_90[0] = 0;
  local_11b = 1;
  local_118 = local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_118 = (string *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_11b = 0;
  local_d0 = local_110;
  local_c8 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x106dfd);
  __l_00._M_len = in_stack_fffffffffffffe20;
  __l_00._M_array = in_stack_fffffffffffffe18;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_fffffffffffffe10,__l_00,in_stack_fffffffffffffe08,
        (allocator_type *)in_stack_fffffffffffffe00);
  local_148 = local_90;
  std::function<void()>::function<testValueless_CallbackCalled_ShouldSucceed()::__0,void>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  juzzlin::Argengine::addOption(local_8,local_c0,local_140,0,local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator(&local_169);
  std::function<void_()>::~function((function<void_()> *)0x106ecb);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x106ed8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x106ee5);
  psVar1 = local_110;
  this = (string *)&local_d0;
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != psVar1);
  std::allocator<char>::~allocator(&local_11a);
  std::allocator<char>::~allocator(&local_119);
  juzzlin::Argengine::parse();
  if ((local_90[0] & 1) != 0) {
    juzzlin::Argengine::~Argengine(local_8);
    return;
  }
  __assert_fail("triggered",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/valueless_test/valueless_test.cpp"
                ,0x3e,"void testValueless_CallbackCalled_ShouldSucceed()");
}

Assistant:

void testValueless_CallbackCalled_ShouldSucceed()
{
    Argengine ae({ "test", "-f" });
    bool triggered {};
    ae.addOption({ "-f", "--foo" }, [&] {
        triggered = true;
    });
    ae.parse();

    assert(triggered);
}